

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O2

real __thiscall
fasttext::ProductQuantizer::mulcode
          (ProductQuantizer *this,Vector *x,uint8_t *codes,int32_t t,real alpha)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  real *prVar4;
  ulong uVar5;
  ulong uVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  
  iVar1 = this->dsub_;
  uVar2 = this->nsubq_;
  uVar3 = this->lastdsub_;
  uVar9 = 0;
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = uVar9;
  }
  pfVar7 = (x->data_).mem_;
  fVar11 = 0.0;
  uVar10 = (long)iVar1;
  for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
    prVar4 = get_centroids(this,(int32_t)uVar9,codes[uVar9 + (long)(int)(t * uVar2)]);
    uVar10 = uVar10 & 0xffffffff;
    if (uVar9 == uVar2 - 1) {
      uVar10 = (ulong)uVar3;
    }
    uVar5 = 0;
    if (0 < (int)uVar10) {
      uVar5 = uVar10;
    }
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      fVar11 = fVar11 + pfVar7[uVar6] * prVar4[uVar6];
    }
    pfVar7 = pfVar7 + iVar1;
  }
  return fVar11 * alpha;
}

Assistant:

real ProductQuantizer::mulcode(
    const Vector& x,
    const uint8_t* codes,
    int32_t t,
    real alpha) const {
  real res = 0.0;
  auto d = dsub_;
  const uint8_t* code = codes + nsubq_ * t;
  for (auto m = 0; m < nsubq_; m++) {
    const real* c = get_centroids(m, code[m]);
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    for (auto n = 0; n < d; n++) {
      res += x[m * dsub_ + n] * c[n];
    }
  }
  return res * alpha;
}